

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

bool __thiscall FIX::Session::resend(Session *this,Message *message)

{
  Header *this_00;
  UtcTimeStampField *this_01;
  BOOLEAN local_89;
  FieldBase local_88;
  
  this_00 = &message->m_header;
  this_01 = &FieldMap::getField<FIX::SendingTime>(&this_00->super_FieldMap)->super_UtcTimeStampField
  ;
  FieldMap::getField<FIX::MsgSeqNum>(&this_00->super_FieldMap);
  UtcTimeStampField::getValue((UtcTimeStamp *)&local_88,this_01);
  insertOrigSendingTime(this,this_00,(UtcTimeStamp *)&local_88);
  local_89 = true;
  PossDupFlag::PossDupFlag((PossDupFlag *)&local_88,&local_89);
  FieldMap::setField(&this_00->super_FieldMap,&local_88,true);
  FieldBase::~FieldBase(&local_88);
  insertSendingTime(this,this_00);
  (**(code **)(*(long *)this->m_application + 0x30))(this->m_application,message,&this->m_sessionID)
  ;
  return true;
}

Assistant:

bool Session::resend(Message &message) {
  Header &header = message.getHeader();
  auto const &sendingTime = header.getField<SendingTime>();
  header.getField<MsgSeqNum>();
  insertOrigSendingTime(header, sendingTime);
  header.setField(PossDupFlag(true));
  insertSendingTime(header);

  try {
    m_application.toApp(message, m_sessionID);
    return true;
  } catch (DoNotSend &) {
    return false;
  }
}